

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editorsmodel.cpp
# Opt level: O0

bool __thiscall EditorsModel::isEmpty(EditorsModel *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QModelIndex local_c0;
  undefined1 local_a8 [24];
  QVariant local_90;
  QString local_70;
  QModelIndex local_58;
  int local_3c;
  int c;
  int local_1c;
  EditorsModel *pEStack_18;
  int r;
  EditorsModel *this_local;
  
  local_1c = 0;
  pEStack_18 = this;
  do {
    iVar1 = local_1c;
    QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffffc8);
    iVar4 = (**(code **)(*(long *)this + 0x78))(this,&stack0xffffffffffffffc8);
    if (iVar4 <= iVar1) {
      return true;
    }
    local_3c = 0;
    while( true ) {
      iVar1 = local_3c;
      QModelIndex::QModelIndex(&local_58);
      iVar5 = (**(code **)(*(long *)this + 0x80))(this,&local_58);
      iVar2 = local_1c;
      iVar4 = local_3c;
      if (iVar5 <= iVar1) break;
      QModelIndex::QModelIndex(&local_c0);
      (**(code **)(*(long *)this + 0x60))(local_a8,this,iVar2,iVar4,&local_c0);
      (**(code **)(*(long *)this + 0x90))(&local_90,this,local_a8,0);
      QVariant::toString();
      bVar3 = QString::isEmpty(&local_70);
      QString::~QString(&local_70);
      QVariant::~QVariant(&local_90);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        return false;
      }
      local_3c = local_3c + 1;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool EditorsModel::isEmpty() const
{
    for(int r=0;r<rowCount();r++) {
        for (int c=0;c<columnCount();c++) {
            if (!data(index(r,c)).toString().isEmpty()) {
                return false;
            }
        }
    }
    return true;
}